

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void make_noise(player *p)

{
  _Bool _Var1;
  uint uVar2;
  wchar_t wVar3;
  queue *q;
  size_t sVar4;
  uintptr_t uVar5;
  loc_conflict grid_00;
  wchar_t local_40;
  wchar_t wStack_3c;
  loc grid;
  queue *queue;
  uint local_28;
  wchar_t noise_increment;
  wchar_t noise;
  wchar_t d;
  wchar_t x;
  wchar_t y;
  loc next;
  player *p_local;
  
  _x = p->grid;
  uVar2 = 1;
  if (p->timed[0x2e] != 0) {
    uVar2 = 4;
  }
  next = (loc)p;
  q = q_new((long)(cave->height * cave->width));
  for (d = L'\x01'; d < cave->height + L'\xffffffff'; d = d + L'\x01') {
    for (noise = L'\x01'; noise < cave->width + L'\xffffffff'; noise = noise + L'\x01') {
      (cave->noise).grids[d][noise] = 0;
    }
  }
  (cave->noise).grids[y][x] = 0;
  wVar3 = grid_to_i(_x,cave->width);
  q_push(q,(long)wVar3);
  local_28 = uVar2;
  while (sVar4 = q_len(q), sVar4 != 0) {
    uVar5 = q_pop(q);
    i_to_grid((wchar_t)uVar5,cave->width,(loc *)&x);
    if ((cave->noise).grids[y][x] == local_28) {
      wVar3 = grid_to_i(_x,cave->width);
      q_push(q,(long)wVar3);
      local_28 = uVar2 + local_28;
    }
    else {
      for (noise_increment = L'\0'; noise_increment < L'\b';
          noise_increment = noise_increment + L'\x01') {
        grid_00 = (loc_conflict)loc_sum(_x,ddgrid_ddd[noise_increment]);
        _Var1 = square_in_bounds((chunk *)cave,grid_00);
        if ((_Var1) && (_Var1 = square_isnoflow((chunk *)cave,grid_00), !_Var1)) {
          wStack_3c = grid_00.y;
          local_40 = grid_00.x;
          if (((cave->noise).grids[wStack_3c][local_40] == 0) &&
             (_Var1 = loc_eq(*(loc *)((long)next + 0x10),(loc)grid_00), !_Var1)) {
            (cave->noise).grids[wStack_3c][local_40] = (uint16_t)local_28;
            wVar3 = grid_to_i((loc)grid_00,cave->width);
            q_push(q,(long)wVar3);
          }
        }
      }
    }
  }
  q_free(q);
  return;
}

Assistant:

static void make_noise(struct player *p)
{
	struct loc next = p->grid;
	int y, x, d;
	int noise = 0;
	int noise_increment = p->timed[TMD_COVERTRACKS] ? 4 : 1;
    struct queue *queue = q_new(cave->height * cave->width);

	/* Set all the grids to silence */
	for (y = 1; y < cave->height - 1; y++) {
		for (x = 1; x < cave->width - 1; x++) {
			cave->noise.grids[y][x] = 0;
		}
	}

	/* Player makes noise */
	cave->noise.grids[next.y][next.x] = noise;
	q_push_int(queue, grid_to_i(next, cave->width));
	noise += noise_increment;

	/* Propagate noise */
	while (q_len(queue) > 0) {
		/* Get the next grid */
		i_to_grid(q_pop_int(queue), cave->width, &next);

		/* If we've reached the current noise level, put it back and step */
		if (cave->noise.grids[next.y][next.x] == noise) {
			q_push_int(queue, grid_to_i(next, cave->width));
			noise += noise_increment;
			continue;
		}

		/* Assign noise to the children and enqueue them */
		for (d = 0; d < 8; d++)	{
			/* Child location */
			struct loc grid = loc_sum(next, ddgrid_ddd[d]);

			if (!square_in_bounds(cave, grid)) continue;

			/* Ignore features that don't transmit sound */
			if (square_isnoflow(cave, grid)) continue;

			/* Skip grids that already have noise */
			if (cave->noise.grids[grid.y][grid.x] != 0) continue;

			/* Skip the player grid */
			if (loc_eq(p->grid, grid)) continue;

			/* Save the noise */
			cave->noise.grids[grid.y][grid.x] = noise;

			/* Enqueue that entry */
			q_push_int(queue, grid_to_i(grid, cave->width));
		}
	}

	q_free(queue);
}